

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::DumpArg<Js::OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
               (OpCode op,OpLayoutT_Arg<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((ushort)(op - ArgOut_A) < 3) {
    Output::Print(L" Out%d =",(ulong)data->Arg);
    Output::Print(L" R%d ",(ulong)data->Reg);
    return;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                              ,0x4af,"(false)","Unknown OpCode for OpLayoutArg");
  if (bVar2) {
    *puVar3 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeDumper::DumpArg(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::ProfiledArgOut_A:
            case OpCode::ArgOut_A:
            case OpCode::ArgOut_ANonVar:
            {
                Output::Print(_u(" Out%d ="), (int) data->Arg);
                DumpReg(data->Reg);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutArg");
                break;
            }
        }
    }